

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QPostEvent>::emplace<QPostEvent_const&>
          (QMovableArrayOps<QPostEvent> *this,qsizetype i,QPostEvent *args)

{
  QPostEvent **ppQVar1;
  qsizetype *pqVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  int iVar7;
  Data *pDVar8;
  long lVar9;
  QPostEvent *pQVar10;
  QObject *pQVar11;
  QEvent *pQVar12;
  QPostEvent *pQVar13;
  undefined4 uVar14;
  qsizetype qVar15;
  long in_FS_OFFSET;
  bool bVar16;
  Inserter local_60;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar8 = (this->super_QGenericArrayOps<QPostEvent>).super_QArrayDataPointer<QPostEvent>.d;
  if ((pDVar8 == (Data *)0x0) ||
     (1 < (__int_type_conflict)(pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>))
  goto LAB_00307531;
  if ((this->super_QGenericArrayOps<QPostEvent>).super_QArrayDataPointer<QPostEvent>.size == i) {
    qVar15 = QArrayDataPointer<QPostEvent>::freeSpaceAtEnd((QArrayDataPointer<QPostEvent> *)this);
    if (qVar15 == 0) goto LAB_00307528;
    lVar9 = (this->super_QGenericArrayOps<QPostEvent>).super_QArrayDataPointer<QPostEvent>.size;
    pQVar10 = (this->super_QGenericArrayOps<QPostEvent>).super_QArrayDataPointer<QPostEvent>.ptr;
    uVar14 = *(undefined4 *)&args->field_0x14;
    pQVar13 = pQVar10 + lVar9;
    pQVar13->priority = args->priority;
    *(undefined4 *)&pQVar13->field_0x14 = uVar14;
    pQVar12 = args->event;
    pQVar10 = pQVar10 + lVar9;
    pQVar10->receiver = args->receiver;
    pQVar10->event = pQVar12;
  }
  else {
LAB_00307528:
    if (i == 0) {
      qVar15 = QArrayDataPointer<QPostEvent>::freeSpaceAtBegin
                         ((QArrayDataPointer<QPostEvent> *)this);
      if (qVar15 == 0) goto LAB_00307531;
      pQVar10 = (this->super_QGenericArrayOps<QPostEvent>).super_QArrayDataPointer<QPostEvent>.ptr;
      uVar14 = *(undefined4 *)&args->field_0x14;
      pQVar10[-1].priority = args->priority;
      *(undefined4 *)&pQVar10[-1].field_0x14 = uVar14;
      pQVar12 = args->event;
      pQVar10[-1].receiver = args->receiver;
      pQVar10[-1].event = pQVar12;
    }
    else {
LAB_00307531:
      pQVar11 = args->receiver;
      pQVar12 = args->event;
      iVar7 = args->priority;
      uVar3 = args->field_0x14;
      uVar4 = args->field_0x15;
      uVar5 = args->field_0x16;
      uVar6 = args->field_0x17;
      bVar16 = (this->super_QGenericArrayOps<QPostEvent>).super_QArrayDataPointer<QPostEvent>.size
               != 0;
      QArrayDataPointer<QPostEvent>::detachAndGrow
                ((QArrayDataPointer<QPostEvent> *)this,(uint)(i == 0 && bVar16),1,(QPostEvent **)0x0
                 ,(QArrayDataPointer<QPostEvent> *)0x0);
      if (i != 0 || !bVar16) {
        Inserter::Inserter(&local_60,(QArrayDataPointer<QPostEvent> *)this,i,1);
        (local_60.displaceFrom)->receiver = pQVar11;
        (local_60.displaceFrom)->event = pQVar12;
        (local_60.displaceFrom)->priority = iVar7;
        (local_60.displaceFrom)->field_0x14 = uVar3;
        (local_60.displaceFrom)->field_0x15 = uVar4;
        (local_60.displaceFrom)->field_0x16 = uVar5;
        (local_60.displaceFrom)->field_0x17 = uVar6;
        (local_60.data)->size = (local_60.data)->size + local_60.nInserts;
        goto LAB_0030760d;
      }
      pQVar10 = (this->super_QGenericArrayOps<QPostEvent>).super_QArrayDataPointer<QPostEvent>.ptr;
      pQVar10[-1].receiver = pQVar11;
      pQVar10[-1].event = pQVar12;
      pQVar10[-1].priority = iVar7;
      pQVar10[-1].field_0x14 = uVar3;
      pQVar10[-1].field_0x15 = uVar4;
      pQVar10[-1].field_0x16 = uVar5;
      pQVar10[-1].field_0x17 = uVar6;
    }
    ppQVar1 = &(this->super_QGenericArrayOps<QPostEvent>).super_QArrayDataPointer<QPostEvent>.ptr;
    *ppQVar1 = *ppQVar1 + -1;
  }
  pqVar2 = &(this->super_QGenericArrayOps<QPostEvent>).super_QArrayDataPointer<QPostEvent>.size;
  *pqVar2 = *pqVar2 + 1;
LAB_0030760d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }